

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O2

int dwarf_get_fde_info_for_reg3_c
              (Dwarf_Fde_conflict fde,Dwarf_Half table_column,Dwarf_Addr pc_requested,
              Dwarf_Small *value_type,Dwarf_Unsigned *offset_relevant,Dwarf_Unsigned *register_num,
              Dwarf_Signed *offset,Dwarf_Block *block,Dwarf_Addr *row_pc_out,
              Dwarf_Bool *has_more_rows,Dwarf_Addr *subsequent_pc,Dwarf_Error *error)

{
  Dwarf_Frame_s *fde_table;
  Dwarf_Block *pDVar1;
  Dwarf_Debug dbg;
  Dwarf_Reg_Rule_s *pDVar2;
  ulong table_real_data_size;
  Dwarf_Unsigned DVar3;
  Dwarf_Ptr pvVar4;
  Dwarf_Unsigned DVar5;
  undefined7 uVar6;
  int iVar7;
  
  if (fde == (Dwarf_Fde_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x5c);
    return 1;
  }
  dbg = fde->fd_dbg;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x5d,
                        "DW_DLE_FDE_DBG_NULL: An fde contains a stale Dwarf_Debug ");
    return 1;
  }
  fde_table = &fde->fd_fde_table;
  if (fde->fd_have_fde_tab != 0) {
    if (fde->fd_fde_pc_requested == pc_requested) goto LAB_001b5e2a;
    _dwarf_free_fde_table(fde_table);
    fde->fd_have_fde_tab = 0;
  }
  table_real_data_size = dbg->de_frame_reg_rules_entry_count;
  iVar7 = _dwarf_initialize_fde_table(dbg,fde_table,table_real_data_size,error);
  if (iVar7 != 0) {
    return 1;
  }
  if (table_real_data_size <= table_column) {
    _dwarf_free_fde_table(fde_table);
    fde->fd_have_fde_tab = 0;
    _dwarf_error(dbg,error,0x60);
    return 1;
  }
  iVar7 = _dwarf_get_fde_info_for_a_pc_row
                    (fde,pc_requested,fde_table,dbg->de_frame_cfa_col_number,has_more_rows,
                     subsequent_pc,error);
  if (iVar7 != 0) {
    _dwarf_free_fde_table(fde_table);
    fde->fd_have_fde_tab = 0;
    return iVar7;
  }
LAB_001b5e2a:
  if (register_num != (Dwarf_Unsigned *)0x0) {
    *register_num = (fde->fd_fde_table).fr_reg[table_column].ru_register;
  }
  if (offset != (Dwarf_Signed *)0x0) {
    *offset = (fde->fd_fde_table).fr_reg[table_column].ru_offset;
  }
  if (row_pc_out != (Dwarf_Addr *)0x0) {
    *row_pc_out = fde_table->fr_loc;
  }
  if (block != (Dwarf_Block *)0x0) {
    pDVar2 = (fde->fd_fde_table).fr_reg;
    pDVar1 = &pDVar2[table_column].ru_block;
    DVar3 = pDVar1->bl_len;
    pvVar4 = pDVar1->bl_data;
    pDVar2 = pDVar2 + table_column;
    uVar6 = *(undefined7 *)&(pDVar2->ru_block).field_0x11;
    DVar5 = *(Dwarf_Unsigned *)(&(pDVar2->ru_block).bl_from_loclist + 8);
    block->bl_from_loclist = (pDVar2->ru_block).bl_from_loclist;
    *(undefined7 *)&block->field_0x11 = uVar6;
    block->bl_section_offset = DVar5;
    block->bl_len = DVar3;
    block->bl_data = pvVar4;
  }
  *value_type = (fde->fd_fde_table).fr_reg[table_column].ru_value_type;
  *offset_relevant = (long)(fde->fd_fde_table).fr_reg[table_column].ru_is_offset;
  fde->fd_have_fde_tab = 1;
  fde->fd_fde_pc_requested = pc_requested;
  return 0;
}

Assistant:

int
dwarf_get_fde_info_for_reg3_c(Dwarf_Fde fde,
    Dwarf_Half      table_column,
    Dwarf_Addr      pc_requested,
    Dwarf_Small    *value_type,
    Dwarf_Unsigned *offset_relevant,
    Dwarf_Unsigned *register_num,
    Dwarf_Signed   *offset,
    Dwarf_Block    *block,
    Dwarf_Addr     *row_pc_out,
    Dwarf_Bool     *has_more_rows,
    Dwarf_Addr     *subsequent_pc,
    Dwarf_Error    *error)
{
    struct Dwarf_Frame_s * fde_table = &(fde->fd_fde_table);
    int res = DW_DLV_ERROR;

    Dwarf_Debug dbg = 0;
    Dwarf_Unsigned table_real_data_size = 0;

    FDE_NULL_CHECKS_AND_SET_DBG(fde, dbg);

    if (!fde->fd_have_fde_tab  ||
    /*  The test is just in case it's not inside the table.
        For non-MIPS
        it could be outside the table and that is just fine, it was
        really a mistake to put it in the table in 1993.  */
        fde->fd_fde_pc_requested != pc_requested) {
        if (fde->fd_have_fde_tab) {
            _dwarf_free_fde_table(fde_table);
            fde->fd_have_fde_tab = FALSE;
        }
        table_real_data_size = dbg->de_frame_reg_rules_entry_count;
        res = _dwarf_initialize_fde_table(dbg, fde_table,
            table_real_data_size, error);
        if (res != DW_DLV_OK) {
            return res;
        }
        if (table_column >= table_real_data_size) {
            _dwarf_free_fde_table(fde_table);
            fde->fd_have_fde_tab = FALSE;
            _dwarf_error(dbg, error, DW_DLE_FRAME_TABLE_COL_BAD);
            return DW_DLV_ERROR;
        }

        /*  _dwarf_get_fde_info_for_a_pc_row will perform
            more sanity checks */
        res = _dwarf_get_fde_info_for_a_pc_row(fde,
            pc_requested, fde_table,
            dbg->de_frame_cfa_col_number,
            has_more_rows,subsequent_pc,
            error);
        if (res != DW_DLV_OK) {
            _dwarf_free_fde_table(fde_table);
            fde->fd_have_fde_tab = FALSE;
            return res;
        }
    }

    if (register_num) {
        *register_num = fde_table->fr_reg[table_column].ru_register;
    }
    if (offset) {
        *offset = fde_table->fr_reg[table_column].ru_offset;
    }
    if (row_pc_out != NULL) {
        *row_pc_out = fde_table->fr_loc;
    }
    if (block) {
        *block = fde_table->fr_reg[table_column].ru_block;
    }

    /*  Without value_type the data cannot be understood,
        so we insist on it being present, we don't test it. */
    *value_type = fde_table->fr_reg[table_column].ru_value_type;
    *offset_relevant = (fde_table->fr_reg[table_column].ru_is_offset);
    fde->fd_have_fde_tab = TRUE;
    fde->fd_fde_pc_requested = pc_requested;
    return DW_DLV_OK;

}